

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

WeakPtr __thiscall
hwnet::util::TimerRoutine::
addTimer<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::shared_ptr<hwnet::TCPSocket>&>
          (TimerRoutine *this,milliseconds timeout,
          _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *callback,
          shared_ptr<hwnet::TCPSocket> *args)

{
  Timer *this_00;
  milliseconds mVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  WeakPtr WVar2;
  lock_guard<std::mutex> local_a0;
  lock_guard<std::mutex> guard;
  type local_90;
  Callback local_78;
  _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *local_48;
  undefined1 local_40 [8];
  Ptr timer;
  shared_ptr<hwnet::TCPSocket> *args_local;
  _func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *callback_local;
  milliseconds timeout_local;
  TimerRoutine *this_local;
  
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_R8
  ;
  callback_local = callback;
  timeout_local = timeout;
  this_local = this;
  this_00 = (Timer *)operator_new(0x78);
  guard._M_device._7_1_ = 1;
  mVar1 = getMilliseconds((TimerRoutine *)timeout);
  local_48 = callback_local + mVar1;
  std::
  bind<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>),std::_Placeholder<1>const&,std::shared_ptr<hwnet::TCPSocket>&>
            (&local_90,
             (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> *)args,
             (_Placeholder<1> *)&std::placeholders::_1,
             (shared_ptr<hwnet::TCPSocket> *)
             timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  std::function<void(std::shared_ptr<hwnet::util::Timer>const&)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<hwnet::TCPSocket>))(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPSocket>)>,void>
            ((function<void(std::shared_ptr<hwnet::util::Timer>const&)> *)&local_78,&local_90);
  Timer::Timer(this_00,(milliseconds *)&local_48,(milliseconds *)&callback_local,false,&local_78);
  guard._M_device._7_1_ = 0;
  std::shared_ptr<hwnet::util::Timer>::shared_ptr<hwnet::util::Timer,void>
            ((shared_ptr<hwnet::util::Timer> *)local_40,this_00);
  std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::~function(&local_78);
  std::
  _Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<hwnet::TCPSocket>))(const_std::shared_ptr<hwnet::util::Timer>_&,_std::shared_ptr<hwnet::TCPSocket>)>
  ::~_Bind(&local_90);
  std::lock_guard<std::mutex>::lock_guard(&local_a0,(mutex_type *)(timeout + 0x18));
  TimerMgr::insert((TimerMgr *)timeout,(Ptr *)local_40);
  if (((*(byte *)(timeout + 0xc0) & 1) != 0) &&
     (callback_local <
      *(_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> **)
       (timeout + 0xb8))) {
    *(_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPSocket> **)(timeout + 0xb8)
         = callback_local;
    std::_V2::condition_variable_any::notify_one((condition_variable_any *)(timeout + 0x60));
  }
  std::weak_ptr<hwnet::util::Timer>::weak_ptr<hwnet::util::Timer,void>
            ((weak_ptr<hwnet::util::Timer> *)this,(shared_ptr<hwnet::util::Timer> *)local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_a0);
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_40);
  WVar2.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  WVar2.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (WeakPtr)WVar2.super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Timer::WeakPtr addTimer(milliseconds timeout, F&& callback, TArgs&& ...args)
    {
        auto timer = Timer::Ptr(new Timer(getMilliseconds() + timeout,timeout,
        	false,std::bind(std::forward<F>(callback), std::placeholders::_1, std::forward<TArgs>(args)...)));

        std::lock_guard<std::mutex> guard(this->mgr.mtx);
        this->mgr.insert(timer);
        if(waitting && timeout < waitTime) {
        	waitTime = timeout;
        	this->cv.notify_one();
        }        
        return timer;
    }